

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

string * __thiscall
cmStringSorter::ApplyFilter(string *__return_storage_ptr__,cmStringSorter *this,string *argument)

{
  code *pcVar1;
  long lVar2;
  string local_40 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)argument);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    pcVar1 = *(code **)((long)this->filters + lVar2);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(local_40,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_40);
      std::__cxx11::string::~string(local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ApplyFilter(const std::string& argument)
  {
    std::string result = argument;
    for (auto filter : filters) {
      if (filter != nullptr) {
        result = filter(result);
      }
    }
    return result;
  }